

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

size_t bitset_intersection_count(bitset_t *b1,bitset_t *b2)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = b2->arraysize;
  if (b1->arraysize < b2->arraysize) {
    uVar2 = b1->arraysize;
  }
  if (uVar2 != 0) {
    uVar4 = 0;
    sVar1 = 0;
    do {
      uVar3 = b2->array[uVar4] & b1->array[uVar4];
      uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      sVar1 = sVar1 + (((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t bitset_intersection_count(const bitset_t *CROARING_CBITSET_RESTRICT b1,
                                 const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t answer = 0;
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    for (size_t k = 0; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] & b2->array[k]);
    }
    return answer;
}